

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O0

bool __thiscall
TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
          (TaskQueue<std::shared_ptr<VRleTask>_> *this,shared_ptr<VRleTask> *task)

{
  bool bVar1;
  shared_ptr<VRleTask> *in_RDI;
  lock_t lock;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
  *in_stack_ffffffffffffffe0;
  bool local_1;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&stack0xffffffffffffffd8,
             &in_RDI[5].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = std::unique_lock::operator_cast_to_bool((unique_lock<std::mutex> *)0x1343df);
  if ((!bVar1) ||
     (bVar1 = std::deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>::
              empty((deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_> *
                    )0x1343ee), bVar1)) {
    local_1 = false;
  }
  else {
    std::deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>::front
              (in_stack_ffffffffffffffe0);
    std::shared_ptr<VRleTask>::operator=
              ((shared_ptr<VRleTask> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_RDI);
    std::deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>::pop_front
              ((deque<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_1 = true;
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,1));
  return local_1;
}

Assistant:

bool try_pop(Task &task)
    {
        lock_t lock{_mutex, std::try_to_lock};
        if (!lock || _q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }